

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmcmd.cxx
# Opt level: O0

int cmcmd::ExecuteEchoColor
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *args)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  long lVar4;
  ulong uVar5;
  char *pcVar6;
  string local_c0;
  string *local_a0;
  string *progressNum;
  string local_68 [8];
  string value;
  undefined1 local_40 [4];
  uint i;
  string progressDir;
  uint local_18;
  bool newline;
  int color;
  bool enabled;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  newline = true;
  local_18 = 0;
  progressDir.field_2._M_local_buf[0xf] = '\x01';
  std::__cxx11::string::string((string *)local_40);
  for (value.field_2._12_4_ = 2; uVar5 = (ulong)(uint)value.field_2._12_4_,
      sVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(args), uVar5 < sVar2; value.field_2._12_4_ = value.field_2._12_4_ + 1) {
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](args,(ulong)(uint)value.field_2._12_4_);
    lVar4 = std::__cxx11::string::find((char *)pvVar3,0x8ef908);
    if (lVar4 == 0) {
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](args,(ulong)(uint)value.field_2._12_4_);
      std::__cxx11::string::substr((ulong)local_68,(ulong)pvVar3);
      uVar5 = std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) {
        pcVar6 = (char *)std::__cxx11::string::c_str();
        newline = cmSystemTools::IsOn(pcVar6);
      }
      std::__cxx11::string::~string(local_68);
    }
    else {
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](args,(ulong)(uint)value.field_2._12_4_);
      bVar1 = cmHasLiteralPrefix<std::__cxx11::string,16ul>(pvVar3,(char (*) [16])"--progress-dir=")
      ;
      if (bVar1) {
        pvVar3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](args,(ulong)(uint)value.field_2._12_4_);
        std::__cxx11::string::substr((ulong)&progressNum,(ulong)pvVar3);
        std::__cxx11::string::operator=((string *)local_40,(string *)&progressNum);
        std::__cxx11::string::~string((string *)&progressNum);
      }
      else {
        pvVar3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](args,(ulong)(uint)value.field_2._12_4_);
        bVar1 = cmHasLiteralPrefix<std::__cxx11::string,16ul>
                          (pvVar3,(char (*) [16])"--progress-num=");
        if (bVar1) {
          uVar5 = std::__cxx11::string::empty();
          if ((uVar5 & 1) == 0) {
            pvVar3 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](args,(ulong)(uint)value.field_2._12_4_);
            std::__cxx11::string::substr((ulong)&local_c0,(ulong)pvVar3);
            local_a0 = &local_c0;
            cmcmdProgressReport((string *)local_40,local_a0);
            std::__cxx11::string::~string((string *)&local_c0);
          }
        }
        else {
          pvVar3 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](args,(ulong)(uint)value.field_2._12_4_);
          bVar1 = std::operator==(pvVar3,"--normal");
          if (bVar1) {
            local_18 = 0;
          }
          else {
            pvVar3 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](args,(ulong)(uint)value.field_2._12_4_);
            bVar1 = std::operator==(pvVar3,"--black");
            if (bVar1) {
              local_18 = 1;
            }
            else {
              pvVar3 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[](args,(ulong)(uint)value.field_2._12_4_);
              bVar1 = std::operator==(pvVar3,"--red");
              if (bVar1) {
                local_18 = 2;
              }
              else {
                pvVar3 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::operator[](args,(ulong)(uint)value.field_2._12_4_);
                bVar1 = std::operator==(pvVar3,"--green");
                if (bVar1) {
                  local_18 = 3;
                }
                else {
                  pvVar3 = std::
                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::operator[](args,(ulong)(uint)value.field_2._12_4_);
                  bVar1 = std::operator==(pvVar3,"--yellow");
                  if (bVar1) {
                    local_18 = 4;
                  }
                  else {
                    pvVar3 = std::
                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ::operator[](args,(ulong)(uint)value.field_2._12_4_);
                    bVar1 = std::operator==(pvVar3,"--blue");
                    if (bVar1) {
                      local_18 = 5;
                    }
                    else {
                      pvVar3 = std::
                               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ::operator[](args,(ulong)(uint)value.field_2._12_4_);
                      bVar1 = std::operator==(pvVar3,"--magenta");
                      if (bVar1) {
                        local_18 = 6;
                      }
                      else {
                        pvVar3 = std::
                                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ::operator[](args,(ulong)(uint)value.field_2._12_4_);
                        bVar1 = std::operator==(pvVar3,"--cyan");
                        if (bVar1) {
                          local_18 = 7;
                        }
                        else {
                          pvVar3 = std::
                                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ::operator[](args,(ulong)(uint)value.field_2._12_4_);
                          bVar1 = std::operator==(pvVar3,"--white");
                          if (bVar1) {
                            local_18 = 8;
                          }
                          else {
                            pvVar3 = std::
                                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ::operator[](args,(ulong)(uint)value.field_2._12_4_);
                            bVar1 = std::operator==(pvVar3,"--bold");
                            if (bVar1) {
                              local_18 = local_18 | 0x100;
                            }
                            else {
                              pvVar3 = std::
                                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ::operator[](args,(ulong)(uint)value.field_2._12_4_);
                              bVar1 = std::operator==(pvVar3,"--no-newline");
                              if (bVar1) {
                                progressDir.field_2._M_local_buf[0xf] = '\0';
                              }
                              else {
                                pvVar3 = std::
                                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ::operator[](args,(ulong)(uint)value.field_2._12_4_);
                                bVar1 = std::operator==(pvVar3,"--newline");
                                if (bVar1) {
                                  progressDir.field_2._M_local_buf[0xf] = '\x01';
                                }
                                else {
                                  std::
                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ::operator[](args,(ulong)(uint)value.field_2._12_4_);
                                  pcVar6 = (char *)std::__cxx11::string::c_str();
                                  cmSystemTools::MakefileColorEcho
                                            (local_18,pcVar6,
                                             (bool)(progressDir.field_2._M_local_buf[0xf] & 1),
                                             newline);
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  std::__cxx11::string::~string((string *)local_40);
  return 0;
}

Assistant:

int cmcmd::ExecuteEchoColor(std::vector<std::string>& args)
{
  // The arguments are
  //   argv[0] == <cmake-executable>
  //   argv[1] == cmake_echo_color

  bool enabled = true;
  int color = cmsysTerminal_Color_Normal;
  bool newline = true;
  std::string progressDir;
  for(unsigned int i=2; i < args.size(); ++i)
    {
    if(args[i].find("--switch=") == 0)
      {
      // Enable or disable color based on the switch value.
      std::string value = args[i].substr(9);
      if(!value.empty())
        {
        if(cmSystemTools::IsOn(value.c_str()))
          {
          enabled = true;
          }
        else
          {
          enabled = false;
          }
        }
      }
    else if(cmHasLiteralPrefix(args[i], "--progress-dir="))
      {
      progressDir = args[i].substr(15);
      }
    else if(cmHasLiteralPrefix(args[i], "--progress-num="))
      {
      if (!progressDir.empty())
        {
        std::string const& progressNum = args[i].substr(15);
        cmcmdProgressReport(progressDir, progressNum);
        }
      }
    else if(args[i] == "--normal")
      {
      color = cmsysTerminal_Color_Normal;
      }
    else if(args[i] == "--black")
      {
      color = cmsysTerminal_Color_ForegroundBlack;
      }
    else if(args[i] == "--red")
      {
      color = cmsysTerminal_Color_ForegroundRed;
      }
    else if(args[i] == "--green")
      {
      color = cmsysTerminal_Color_ForegroundGreen;
      }
    else if(args[i] == "--yellow")
      {
      color = cmsysTerminal_Color_ForegroundYellow;
      }
    else if(args[i] == "--blue")
      {
      color = cmsysTerminal_Color_ForegroundBlue;
      }
    else if(args[i] == "--magenta")
      {
      color = cmsysTerminal_Color_ForegroundMagenta;
      }
    else if(args[i] == "--cyan")
      {
      color = cmsysTerminal_Color_ForegroundCyan;
      }
    else if(args[i] == "--white")
      {
      color = cmsysTerminal_Color_ForegroundWhite;
      }
    else if(args[i] == "--bold")
      {
      color |= cmsysTerminal_Color_ForegroundBold;
      }
    else if(args[i] == "--no-newline")
      {
      newline = false;
      }
    else if(args[i] == "--newline")
      {
      newline = true;
      }
    else
      {
      // Color is enabled.  Print with the current color.
      cmSystemTools::MakefileColorEcho(color, args[i].c_str(),
                                       newline, enabled);
      }
    }

  return 0;
}